

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O3

void __thiscall
nonius::standard_reporter::do_params_start(standard_reporter *this,parameters *params)

{
  basic_ostream<char,_std::char_traits<char>_> *os;
  
  if ((this->summary == false) &&
     ((params->
      super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
      )._M_h._M_element_count != 0)) {
    if ((this->super_reporter).os.super__Function_base._M_manager != (_Manager_type)0x0) {
      os = (*(this->super_reporter).os._M_invoker)((_Any_data *)&(this->super_reporter).os);
      std::__ostream_insert<char,std::char_traits<char>>(os,"\n\nnew round for parameters\n",0x1b);
      operator<<(os,params);
      return;
    }
    std::__throw_bad_function_call();
  }
  return;
}

Assistant:

void do_params_start(parameters const& params) override {
            if(!summary && !params.empty()) report_stream() << "\n\nnew round for parameters\n" << params;
        }